

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O1

bool __thiscall
cmLoadCommandCommand::InitialPass
          (cmLoadCommandCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  pointer pbVar7;
  LibraryHandle lib;
  SymbolPointer p_Var8;
  cmCommand *command;
  cmState *this_00;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string fullPath;
  string moduleName;
  string reportVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  string initFuncName;
  allocator local_249;
  string local_248;
  string local_228;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  bVar4 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0031,
                     "The load_command command should not be called; see CMP0031.");
  if (bVar4) {
    return true;
  }
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    return true;
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"CMAKE_LOADED_COMMAND_","");
  std::__cxx11::string::_M_append
            ((char *)&local_1e8,
             (ulong)(((args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
  cmMakefile::RemoveDefinition((this->super_cmCommand).Makefile,&local_1e8);
  pcVar2 = (this->super_cmCommand).Makefile;
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CMAKE_SHARED_MODULE_PREFIX","");
  pcVar6 = cmMakefile::GetRequiredDefinition(pcVar2,(string *)local_1a8);
  std::__cxx11::string::string((string *)&local_208,pcVar6,(allocator *)&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,"cm"
                 ,(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::_M_append((char *)&local_208,local_1a8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CMAKE_SHARED_MODULE_SUFFIX","");
  cmMakefile::GetRequiredDefinition(pcVar2,(string *)local_1a8);
  std::__cxx11::string::append((char *)&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7)) {
    uVar10 = 1;
    uVar11 = 2;
    do {
      pcVar3 = pbVar7[uVar10]._M_dataplus._M_p;
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar3,pcVar3 + pbVar7[uVar10]._M_string_length);
      cmSystemTools::ExpandRegistryValues((string *)local_1a8,KeyWOW64_Default);
      cmSystemTools::GlobDirs((string *)local_1a8,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar4 = uVar11 < (ulong)((long)(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5
                              );
      uVar10 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar4);
  }
  std::__cxx11::string::string((string *)local_1a8,(char *)local_208,(allocator *)&local_248);
  cmsys::SystemTools::FindFile(&local_228,(string *)local_1a8,&local_1c8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_228);
  if (iVar5 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Attempt to load command failed from file \"",0x2a);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_208,local_200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    lib = cmDynamicLoader::OpenLibrary(local_228._M_dataplus._M_p);
    if (lib != (LibraryHandle)0x0) {
      cmMakefile::AddDefinition
                ((this->super_cmCommand).Makefile,&local_1e8,local_228._M_dataplus._M_p);
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = (pbVar7->_M_dataplus)._M_p;
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar3,pcVar3 + pbVar7->_M_string_length);
      std::__cxx11::string::append(local_1a8);
      std::__cxx11::string::string((string *)&local_248,(char *)local_1a8._0_8_,&local_249);
      p_Var8 = cmsys::DynamicLoader::GetSymbolAddress(lib,&local_248);
      paVar1 = &local_248.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar1) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (p_Var8 == (SymbolPointer)0x0) {
        std::__cxx11::string::_M_replace((ulong)local_1a8,0,(char *)local_1a8._8_8_,0x4e2d63);
        std::__cxx11::string::_M_append
                  (local_1a8,
                   (ulong)(((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        std::__cxx11::string::append(local_1a8);
        std::__cxx11::string::string((string *)&local_248,(char *)local_1a8._0_8_,&local_249);
        p_Var8 = cmsys::DynamicLoader::GetSymbolAddress(lib,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar1) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
      }
      bVar4 = p_Var8 != (SymbolPointer)0x0;
      if (p_Var8 == (SymbolPointer)0x0) {
        local_248._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_248,"Attempt to load command failed. No init function found.",""
                  );
        cmCommand::SetError(&this->super_cmCommand,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar1) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        command = (cmCommand *)operator_new(0xb0);
        (command->Helper).Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (command->Helper).Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (command->Helper).Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (command->Error)._M_dataplus._M_p = (pointer)&(command->Error).field_2;
        (command->Error)._M_string_length = 0;
        (command->Error).field_2._M_local_buf[0] = '\0';
        command->Makefile = (cmMakefile *)0x0;
        command->Enabled = true;
        (command->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmLoadedCommand_005b3b30;
        command[1].Helper.Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        command[1].Helper.Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        command[1].super_cmObject._vptr_cmObject = (_func_int **)0x0;
        command[1].Makefile = (cmMakefile *)0x0;
        command[1].Helper.Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined8 *)&command[1].Enabled = 0;
        command[1].Error._M_dataplus._M_p = (pointer)0x0;
        command[1].Error._M_string_length = 0;
        command[1].Error.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&command[1].Error.field_2 + 8) = 0;
        command[2].super_cmObject._vptr_cmObject = (_func_int **)0x0;
        command[2].Makefile = (cmMakefile *)0x0;
        command[1].Helper.Arguments.
        super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&cmStaticCAPI;
        (*p_Var8)(command + 1);
        this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        cmState::AddCommand(this_00,command);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      goto LAB_002d4657;
    }
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Attempt to load the library ","");
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,local_228._M_dataplus._M_p,
               local_228._M_dataplus._M_p + local_228._M_string_length);
    std::__cxx11::string::append((char *)&local_248);
    std::__cxx11::string::_M_append(local_1a8,(ulong)local_248._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = cmsys::DynamicLoader::LastError();
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::append(local_1a8);
      std::__cxx11::string::append(local_1a8);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
  }
  bVar4 = false;
LAB_002d4657:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmLoadCommandCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0031,
      "The load_command command should not be called; see CMP0031."))
    { return true; }
  if(args.size() < 1 )
    {
    return true;
    }

  // Construct a variable to report what file was loaded, if any.
  // Start by removing the definition in case of failure.
  std::string reportVar = "CMAKE_LOADED_COMMAND_";
  reportVar += args[0];
  this->Makefile->RemoveDefinition(reportVar);

  // the file must exist
  std::string moduleName =
    this->Makefile->GetRequiredDefinition("CMAKE_SHARED_MODULE_PREFIX");
  moduleName += "cm" + args[0];
  moduleName +=
    this->Makefile->GetRequiredDefinition("CMAKE_SHARED_MODULE_SUFFIX");

  // search for the file
  std::vector<std::string> path;
  for (unsigned int j = 1; j < args.size(); j++)
    {
    // expand variables
    std::string exp = args[j];
    cmSystemTools::ExpandRegistryValues(exp);

    // Glob the entry in case of wildcards.
    cmSystemTools::GlobDirs(exp, path);
    }

  // Try to find the program.
  std::string fullPath = cmSystemTools::FindFile(moduleName.c_str(), path);
  if (fullPath == "")
    {
    std::ostringstream e;
    e << "Attempt to load command failed from file \""
      << moduleName << "\"";
    this->SetError(e.str());
    return false;
    }

  // try loading the shared library / dll
  cmsys::DynamicLoader::LibraryHandle lib
    = cmDynamicLoader::OpenLibrary(fullPath.c_str());
  if(!lib)
    {
    std::string err = "Attempt to load the library ";
    err += fullPath + " failed.";
    const char* error = cmsys::DynamicLoader::LastError();
    if ( error )
      {
      err += " Additional error info is:\n";
      err += error;
      }
    this->SetError(err);
    return false;
    }

  // Report what file was loaded for this command.
  this->Makefile->AddDefinition(reportVar, fullPath.c_str());

  // find the init function
  std::string initFuncName = args[0] + "Init";
  CM_INIT_FUNCTION initFunction
    = (CM_INIT_FUNCTION)
    cmsys::DynamicLoader::GetSymbolAddress(lib, initFuncName.c_str());
  if ( !initFunction )
    {
    initFuncName = "_";
    initFuncName += args[0];
    initFuncName += "Init";
    initFunction = (CM_INIT_FUNCTION)(
      cmsys::DynamicLoader::GetSymbolAddress(lib, initFuncName.c_str()));
    }
  // if the symbol is found call it to set the name on the
  // function blocker
  if(initFunction)
    {
    // create a function blocker and set it up
    cmLoadedCommand *f = new cmLoadedCommand();
    (*initFunction)(&f->info);
    this->Makefile->GetState()->AddCommand(f);
    return true;
    }
  this->SetError("Attempt to load command failed. "
                 "No init function found.");
  return false;
}